

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O2

void __thiscall QKmsScreenConfig::loadConfig(QKmsScreenConfig *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  QDebug *pQVar8;
  long lVar9;
  undefined8 uVar10;
  char *pcVar11;
  int i;
  long lVar12;
  long in_FS_OFFSET;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QAnyStringView QVar20;
  QMap<QString,_QMap<QString,_QVariant>_> local_178;
  undefined1 local_170 [8];
  QArrayDataPointer<char16_t> local_168;
  QArrayDataPointer<char16_t> local_150;
  QArrayDataPointer<char16_t> local_138;
  QVariantMap outputSettings;
  QJsonArray outputs;
  undefined1 local_110 [16];
  QSize local_100;
  QArrayDataPointer<char> local_f8;
  QArrayDataPointer<char16_t> local_d8;
  QJsonObject object;
  QJsonDocument doc;
  undefined8 local_a8;
  undefined8 uStack_a0;
  QArrayDataPointer<char> local_98;
  QArrayDataPointer<char16_t> local_78;
  undefined8 local_60;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.size = -0x5555555555555556;
  local_98.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_98.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  qgetenv((char *)&local_98);
  if (local_98.size == 0) {
    qgetenv((char *)&local_58);
    pDVar2 = (Data *)CONCAT44(local_58._4_4_,local_58._0_4_);
    pcVar11 = (char *)CONCAT44(uStack_4c,uStack_50);
    local_58._0_4_ = SUB84(local_98.d,0);
    local_58._4_4_ = (undefined4)((ulong)local_98.d >> 0x20);
    uStack_50 = SUB84(local_98.ptr,0);
    uStack_4c = (undefined4)((ulong)local_98.ptr >> 0x20);
    lVar12 = CONCAT44(uStack_44,uStack_48);
    uStack_48 = (undefined4)local_98.size;
    uStack_44 = (undefined4)((ulong)local_98.size >> 0x20);
    local_98.d = pDVar2;
    local_98.ptr = pcVar11;
    local_98.size = lVar12;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
    if (local_98.size == 0) goto LAB_00110ff3;
  }
  qLcKmsDebug();
  if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_58._0_4_ = 2;
    local_58._4_4_ = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    uStack_44 = 0;
    local_40 = qLcKmsDebug::category.name;
    QMessageLogger::debug();
    pQVar8 = QDebug::operator<<((QDebug *)&local_78,"Loading KMS setup from");
    QDebug::operator<<(pQVar8,(QByteArray *)&local_98);
    QDebug::~QDebug((QDebug *)&local_78);
  }
  local_a8 = 0xaaaaaaaaaaaaaaaa;
  uStack_a0 = 0xaaaaaaaaaaaaaaaa;
  QString::fromUtf8<void>((QString *)&local_58,(QByteArray *)&local_98);
  QFile::QFile((QFile *)&local_a8,(QString *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  cVar5 = QFile::open((QFile *)&local_a8,1);
  if (cVar5 == '\0') {
    qLcKmsDebug();
    if (((byte)qLcKmsDebug::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_58._0_4_ = 2;
      local_58._4_4_ = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      uStack_44 = 0;
      local_40 = qLcKmsDebug::category.name;
      QMessageLogger::warning();
      pQVar8 = QDebug::operator<<((QDebug *)&local_78,"Could not open config file");
      pQVar8 = QDebug::operator<<(pQVar8,(QByteArray *)&local_98);
      QDebug::operator<<(pQVar8,"for reading");
      QDebug::~QDebug((QDebug *)&local_78);
    }
  }
  else {
    _doc = 0xaaaaaaaaaaaaaaaa;
    QIODevice::readAll();
    QJsonDocument::fromJson((QByteArray *)&doc,(QJsonParseError *)&local_58);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
    cVar5 = QJsonDocument::isObject();
    if (cVar5 == '\0') {
      qLcKmsDebug();
      if (((byte)qLcKmsDebug::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0)
      {
        local_58._0_4_ = 2;
        local_58._4_4_ = 0;
        uStack_50 = 0;
        uStack_4c = 0;
        uStack_48 = 0;
        uStack_44 = 0;
        local_40 = qLcKmsDebug::category.name;
        QMessageLogger::warning();
        pQVar8 = QDebug::operator<<((QDebug *)&local_78,"Invalid config file");
        pQVar8 = QDebug::operator<<(pQVar8,(QByteArray *)&local_98);
        QDebug::operator<<(pQVar8,"- no top-level JSON object");
        QDebug::~QDebug((QDebug *)&local_78);
      }
    }
    else {
      _object = 0xaaaaaaaaaaaaaaaa;
      QJsonDocument::object();
      local_d8.size = -0x5555555555555556;
      local_d8.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_d8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      QVar13.m_data = (char *)&object;
      QVar13.m_size = (qsizetype)&local_58;
      QJsonObject::value(QVar13);
      QJsonValue::toString();
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      local_f8.size = -0x5555555555555556;
      local_f8.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_f8.ptr = (char *)0xaaaaaaaaaaaaaaaa;
      QString::toUtf8_helper((QString *)&local_f8);
      local_100.wd.m_i = -1;
      local_100.ht.m_i = -1;
      pcVar11 = local_f8.ptr;
      if (local_f8.ptr == (char *)0x0) {
        pcVar11 = (char *)&QByteArray::_empty;
      }
      iVar7 = __isoc99_sscanf(pcVar11,"%dx%d",&local_100);
      if (iVar7 == 2) {
        this->m_headlessSize = local_100;
      }
      this->m_headless = iVar7 == 2;
      QVar14.m_data = (char *)&object;
      QVar14.m_size = (qsizetype)&local_58;
      QJsonObject::value(QVar14);
      bVar6 = (bool)QJsonValue::toBool(SUB81(&local_58,0));
      this->m_hwCursor = bVar6;
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      QVar15.m_data = (char *)&object;
      QVar15.m_size = (qsizetype)&local_58;
      QJsonObject::value(QVar15);
      bVar6 = (bool)QJsonValue::toBool(SUB81(&local_58,0));
      this->m_pbuffers = bVar6;
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      QVar16.m_data = (char *)&object;
      QVar16.m_size = (qsizetype)&local_78;
      QJsonObject::value(QVar16);
      QJsonValue::toString();
      pDVar3 = (Data *)CONCAT44(local_58._4_4_,local_58._0_4_);
      pcVar4 = (char16_t *)CONCAT44(uStack_4c,uStack_50);
      local_58._0_4_ = *(undefined4 *)&(this->m_devicePath).d.d;
      local_58._4_4_ = *(undefined4 *)((long)&(this->m_devicePath).d.d + 4);
      uStack_50 = *(undefined4 *)&(this->m_devicePath).d.ptr;
      uStack_4c = *(undefined4 *)((long)&(this->m_devicePath).d.ptr + 4);
      (this->m_devicePath).d.d = pDVar3;
      (this->m_devicePath).d.ptr = pcVar4;
      qVar1 = (this->m_devicePath).d.size;
      (this->m_devicePath).d.size = CONCAT44(uStack_44,uStack_48);
      uStack_48 = (undefined4)qVar1;
      uStack_44 = (undefined4)((ulong)qVar1 >> 0x20);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      QJsonValue::~QJsonValue((QJsonValue *)&local_78);
      QVar17.m_data = (char *)&object;
      QVar17.m_size = (qsizetype)&local_58;
      QJsonObject::value(QVar17);
      bVar6 = (bool)QJsonValue::toBool(SUB81(&local_58,0));
      this->m_separateScreens = bVar6;
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      QVar18.m_data = (char *)&object;
      QVar18.m_size = (qsizetype)&local_58;
      QJsonObject::value(QVar18);
      QVar20.m_size = 0;
      QVar20.field_0.m_data_utf8 = (char *)&local_58;
      QVar20 = (QAnyStringView)QJsonValue::toStringView(QVar20);
      local_110 = (undefined1  [16])QVar20;
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      if (((undefined1  [16])QVar20 & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0
         ) {
        local_58._0_4_ = 0x119244;
        local_58._4_4_ = 0;
        uStack_50 = 10;
        uStack_4c = 0x40000000;
        bVar6 = comparesEqual((QAnyStringView *)local_110,(QAnyStringView *)&local_58);
        if (bVar6) {
          this->m_virtualDesktopLayout = VirtualDesktopLayoutHorizontal;
        }
        else {
          local_58._0_4_ = 0x11924f;
          local_58._4_4_ = 0;
          uStack_50 = 8;
          uStack_4c = 0x40000000;
          bVar6 = comparesEqual((QAnyStringView *)local_110,(QAnyStringView *)&local_58);
          if (bVar6) {
            this->m_virtualDesktopLayout = VirtualDesktopLayoutVertical;
          }
          else {
            qLcKmsDebug();
            if (((byte)qLcKmsDebug::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
                != 0) {
              local_58._0_4_ = 2;
              local_58._4_4_ = 0;
              uStack_50 = 0;
              uStack_4c = 0;
              uStack_48 = 0;
              uStack_44 = 0;
              local_40 = qLcKmsDebug::category.name;
              QAnyStringView::toString((QString *)&local_78,(QAnyStringView *)local_110);
              uVar10 = QString::utf16();
              QMessageLogger::warning
                        ((char *)&local_58,"Unknown virtualDesktopOrientation value %ls",uVar10);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
            }
          }
        }
      }
      _outputs = 0xaaaaaaaaaaaaaaaa;
      QVar19.m_data = (char *)&object;
      QVar19.m_size = (qsizetype)&local_58;
      QJsonObject::value(QVar19);
      QJsonValue::toArray();
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      lVar12 = 0;
      while( true ) {
        lVar9 = QJsonArray::size();
        if (lVar9 <= lVar12) break;
        outputSettings.d.d.ptr =
             (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
              )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
                )0xaaaaaaaaaaaaaaaa;
        QJsonArray::at((longlong)&local_58);
        QJsonValue::toObject();
        QJsonObject::toVariantMap();
        QJsonObject::~QJsonObject((QJsonObject *)&local_78);
        QJsonValue::~QJsonValue((QJsonValue *)&local_58);
        local_78.d = (Data *)0x0;
        local_78.ptr = (char16_t *)0x0;
        local_58._0_4_ = 0;
        local_58._4_4_ = 0;
        uStack_50 = 0x119514;
        uStack_4c = 0;
        local_78.size = 0;
        uStack_48 = 4;
        uStack_44 = 0;
        bVar6 = QMap<QString,_QVariant>::contains(&outputSettings,(QString *)&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        if (bVar6) {
          local_138.size = -0x5555555555555556;
          local_150.d = (Data *)0x0;
          local_168.d = (Data *)0x0;
          local_168.ptr = (char16_t *)0x0;
          local_168.size = 0;
          local_138.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_138.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          local_150.ptr = L"name";
          local_150.size = 4;
          local_78.d = (Data *)0x0;
          local_78.ptr = (char16_t *)0x0;
          local_78.size = 0;
          local_60 = 2;
          QMap<QString,_QVariant>::value
                    ((QVariant *)&local_58,&outputSettings,(QString *)&local_150,
                     (QVariant *)&local_78);
          QVariant::toString();
          QVariant::~QVariant((QVariant *)&local_58);
          QVariant::~QVariant((QVariant *)&local_78);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_150);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
          bVar6 = QMap<QString,_QMap<QString,_QVariant>_>::contains
                            (&this->m_outputSettings,(QString *)&local_138);
          if (bVar6) {
            qLcKmsDebug();
            if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
                != 0) {
              local_58._0_4_ = 2;
              local_58._4_4_ = 0;
              uStack_50 = 0;
              uStack_4c = 0;
              uStack_48 = 0;
              uStack_44 = 0;
              local_40 = qLcKmsDebug::category.name;
              QMessageLogger::debug();
              pQVar8 = QDebug::operator<<((QDebug *)&local_78,"Output");
              pQVar8 = QDebug::operator<<(pQVar8,(QString *)&local_138);
              QDebug::operator<<(pQVar8,"configured multiple times!");
              QDebug::~QDebug((QDebug *)&local_78);
            }
          }
          QMap<QString,_QMap<QString,_QVariant>_>::insert
                    (&this->m_outputSettings,(QString *)&local_138,&outputSettings);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
        }
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&outputSettings.d);
        lVar12 = lVar12 + 1;
      }
      qLcKmsDebug();
      if (((byte)qLcKmsDebug::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_58._0_4_ = 2;
        local_58._4_4_ = 0;
        uStack_50 = 0;
        uStack_4c = 0;
        uStack_48 = 0;
        uStack_44 = 0;
        local_40 = qLcKmsDebug::category.name;
        QMessageLogger::debug();
        pQVar8 = QDebug::operator<<((QDebug *)&local_78,
                                    "Requested configuration (some settings may be ignored):\n");
        pQVar8 = QDebug::operator<<(pQVar8,"\theadless:");
        pQVar8 = QDebug::operator<<(pQVar8,this->m_headless);
        pQVar8 = QDebug::operator<<(pQVar8,"\n");
        pQVar8 = QDebug::operator<<(pQVar8,"\thwcursor:");
        pQVar8 = QDebug::operator<<(pQVar8,this->m_hwCursor);
        pQVar8 = QDebug::operator<<(pQVar8,"\n");
        pQVar8 = QDebug::operator<<(pQVar8,"\tpbuffers:");
        pQVar8 = QDebug::operator<<(pQVar8,this->m_pbuffers);
        pQVar8 = QDebug::operator<<(pQVar8,"\n");
        pQVar8 = QDebug::operator<<(pQVar8,"\tseparateScreens:");
        pQVar8 = QDebug::operator<<(pQVar8,this->m_separateScreens);
        pQVar8 = QDebug::operator<<(pQVar8,"\n");
        pQVar8 = QDebug::operator<<(pQVar8,"\tvirtualDesktopLayout:");
        pQVar8 = QDebug::operator<<(pQVar8,this->m_virtualDesktopLayout);
        pQVar8 = QDebug::operator<<(pQVar8,"\n");
        pQVar8 = QDebug::operator<<(pQVar8,"\toutputs:");
        local_178.d.d.ptr =
             (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
              )pQVar8->stream;
        *(int *)((long)local_178.d.d.ptr + 0x28) = *(int *)((long)local_178.d.d.ptr + 0x28) + 1;
        ::operator<<((Stream *)local_170,&local_178);
        QDebug::~QDebug((QDebug *)local_170);
        QDebug::~QDebug((QDebug *)&local_178);
        QDebug::~QDebug((QDebug *)&local_78);
      }
      QJsonArray::~QJsonArray(&outputs);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      QJsonObject::~QJsonObject(&object);
    }
    QJsonDocument::~QJsonDocument(&doc);
  }
  QFile::~QFile((QFile *)&local_a8);
LAB_00110ff3:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QKmsScreenConfig::loadConfig()
{
    QByteArray json = qgetenv("QT_QPA_EGLFS_KMS_CONFIG");
    if (json.isEmpty()) {
        json = qgetenv("QT_QPA_KMS_CONFIG");
        if (json.isEmpty())
            return;
    }

    qCDebug(qLcKmsDebug) << "Loading KMS setup from" << json;

    QFile file(QString::fromUtf8(json));
    if (!file.open(QFile::ReadOnly)) {
        qCWarning(qLcKmsDebug) << "Could not open config file"
                               << json << "for reading";
        return;
    }

    const QJsonDocument doc = QJsonDocument::fromJson(file.readAll());
    if (!doc.isObject()) {
        qCWarning(qLcKmsDebug) << "Invalid config file" << json
                              << "- no top-level JSON object";
        return;
    }

    const QJsonObject object = doc.object();

    const QString headlessStr = object.value("headless"_L1).toString();
    const QByteArray headless = headlessStr.toUtf8();
    QSize headlessSize;
    if (sscanf(headless.constData(), "%dx%d", &headlessSize.rwidth(), &headlessSize.rheight()) == 2) {
        m_headless = true;
        m_headlessSize = headlessSize;
    } else {
        m_headless = false;
    }

    m_hwCursor = object.value("hwcursor"_L1).toBool(m_hwCursor);
    m_pbuffers = object.value("pbuffers"_L1).toBool(m_pbuffers);
    m_devicePath = object.value("device"_L1).toString();
    m_separateScreens = object.value("separateScreens"_L1).toBool(m_separateScreens);

    const auto vdOriString = object.value("virtualDesktopLayout"_L1).toStringView();
    if (!vdOriString.isEmpty()) {
        if (vdOriString == "horizontal"_L1)
            m_virtualDesktopLayout = VirtualDesktopLayoutHorizontal;
        else if (vdOriString == "vertical"_L1)
            m_virtualDesktopLayout = VirtualDesktopLayoutVertical;
        else
            qCWarning(qLcKmsDebug, "Unknown virtualDesktopOrientation value %ls",
                      qUtf16Printable(vdOriString.toString()));
    }

    const QJsonArray outputs = object.value("outputs"_L1).toArray();
    for (int i = 0; i < outputs.size(); i++) {
        const QVariantMap outputSettings = outputs.at(i).toObject().toVariantMap();

        if (outputSettings.contains(QStringLiteral("name"))) {
            const QString name = outputSettings.value(QStringLiteral("name")).toString();

            if (m_outputSettings.contains(name)) {
                qCDebug(qLcKmsDebug) << "Output" << name << "configured multiple times!";
            }

            m_outputSettings.insert(name, outputSettings);
        }
    }

    qCDebug(qLcKmsDebug) << "Requested configuration (some settings may be ignored):\n"
                         << "\theadless:" << m_headless << "\n"
                         << "\thwcursor:" << m_hwCursor << "\n"
                         << "\tpbuffers:" << m_pbuffers << "\n"
                         << "\tseparateScreens:" << m_separateScreens << "\n"
                         << "\tvirtualDesktopLayout:" << m_virtualDesktopLayout << "\n"
                         << "\toutputs:" << m_outputSettings;
}